

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

string * testing::internal::GetTypeName<long_long>(void)

{
  uint in_EAX;
  char *__ptr;
  string *in_RDI;
  char *pcVar1;
  int status;
  undefined8 uStack_28;
  
  pcVar1 = _append + (*_append == '*');
  uStack_28 = (ulong)in_EAX;
  __ptr = (char *)__cxa_demangle(pcVar1,0,0,(long)&uStack_28 + 4);
  if (uStack_28._4_4_ == 0) {
    pcVar1 = __ptr;
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar1,(allocator *)((long)&uStack_28 + 3));
  free(__ptr);
  return in_RDI;
}

Assistant:

std::string GetTypeName() {
# if GTEST_HAS_RTTI

  const char* const name = typeid(T).name();
#  if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#   if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#   endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, 0, 0, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return name_str;
#  else
  return name;
#  endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC

# else

  return "<type>";

# endif  // GTEST_HAS_RTTI
}